

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

string * __thiscall Context::data_abi_cxx11_(string *__return_storage_ptr__,Context *this)

{
  Context *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_data);
  return __return_storage_ptr__;
}

Assistant:

virtual string data() { return _data; }